

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

void __thiscall CGraphics_Threaded::Shutdown(CGraphics_Threaded *this)

{
  CCommandBuffer *pCVar1;
  uchar *puVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  
  (*this->m_pBackend->_vptr_IGraphicsBackend[3])();
  if (this->m_pBackend != (IGraphicsBackend *)0x0) {
    (*this->m_pBackend->_vptr_IGraphicsBackend[1])();
  }
  this->m_pBackend = (IGraphicsBackend *)0x0;
  lVar4 = 0;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    pCVar1 = this->m_apCommandBuffers[lVar4];
    if (pCVar1 != (CCommandBuffer *)0x0) {
      puVar2 = (pCVar1->m_DataBuffer).m_pData;
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
      }
      (pCVar1->m_DataBuffer).m_pData = (uchar *)0x0;
      (pCVar1->m_DataBuffer).m_Size = 0;
      (pCVar1->m_DataBuffer).m_Used = 0;
      puVar2 = (pCVar1->m_CmdBuffer).m_pData;
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
      }
    }
    operator_delete(pCVar1,0x30);
    lVar4 = 1;
    bVar3 = false;
  } while (bVar5);
  return;
}

Assistant:

void CGraphics_Threaded::Shutdown()
{
	// shutdown the backend
	m_pBackend->Shutdown();
	delete m_pBackend;
	m_pBackend = 0x0;

	// delete the command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		delete m_apCommandBuffers[i];
}